

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_style.c
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  bov_text_param_t parameters_00;
  bov_text_param_t parameters_01;
  bov_text_param_t parameters_02;
  bov_text_param_t parameters_03;
  bov_text_t *pbVar2;
  int iVar3;
  bov_text_t *text;
  GLfloat GVar4;
  float local_1b8;
  float local_1b4;
  double local_1b0;
  double wtime;
  float local_1a0;
  GLfloat local_19c;
  GLubyte aGStack_196 [2];
  GLfloat pixel64;
  GLubyte GStack_190;
  GLubyte GStack_18f;
  GLubyte local_18e [22];
  bov_text_t *local_178;
  bov_text_t *unzoomable;
  bov_text_t *local_110;
  bov_text_t *pixel;
  GLubyte local_fd [13];
  bov_text_t *local_f0;
  bov_text_t *fontSize;
  GLubyte local_de [22];
  bov_text_t *local_c8;
  bov_text_t *shift;
  GLfloat local_b8 [4];
  GLubyte local_a6 [14];
  bov_text_t *local_98;
  bov_text_t *width;
  bov_text_param_t parameters;
  GLubyte GStack_48;
  GLubyte GStack_47;
  bov_text_t *outline;
  undefined4 local_28;
  undefined4 local_24;
  bov_window_t *local_20;
  bov_window_t *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (bov_window_t *)argv;
  argv_local._0_4_ = argc;
  local_20 = bov_window_new(0,0,*argv);
  outline._0_4_ = 0x3f4ccccd;
  outline._4_4_ = 0x3f4ccccd;
  local_28 = 0x3f4ccccd;
  local_24 = 0x3f800000;
  bov_window_set_color(local_20,(GLfloat *)&outline);
  parameters.outlineWidth._2_1_ = 'v';
  parameters.outlineWidth._3_1_ = 'a';
  parameters.spaceType._0_1_ = 'r';
  parameters.spaceType._1_1_ = 'y';
  parameters.spaceType._2_1_ = 'i';
  parameters.spaceType._3_1_ = 'n';
  GStack_48 = 'g';
  GStack_47 = ' ';
  text = bov_text_new((GLubyte *)((long)&parameters.outlineWidth + 2),0x88e4);
  memcpy(&width,&DAT_0012a140,0x40);
  parameters_00.fillColor[2] = parameters.fillColor[0];
  parameters_00.fillColor[3] = parameters.fillColor[1];
  parameters_00.fillColor._0_8_ = width;
  parameters_00.outlineColor[0] = parameters.fillColor[2];
  parameters_00.outlineColor[1] = parameters.fillColor[3];
  parameters_00.outlineColor[2] = parameters.outlineColor[0];
  parameters_00.outlineColor[3] = parameters.outlineColor[1];
  parameters_00.pos[0] = parameters.outlineColor[2];
  parameters_00.pos[1] = parameters.outlineColor[3];
  parameters_00.shift[0] = parameters.pos[0];
  parameters_00.shift[1] = parameters.pos[1];
  parameters_00.fontSize = parameters.shift[0];
  parameters_00.boldness = parameters.shift[1];
  parameters_00.outlineWidth = parameters.fontSize;
  parameters_00.spaceType = (bov_space_type_t)parameters.boldness;
  bov_text_set_param(text,parameters_00);
  builtin_memcpy(local_a6,"varying width",0xe);
  local_98 = bov_text_new(local_a6,0x88e4);
  parameters_01.fillColor[2] = parameters.fillColor[0];
  parameters_01.fillColor[3] = parameters.fillColor[1];
  parameters_01.fillColor._0_8_ = width;
  parameters_01.outlineColor[0] = parameters.fillColor[2];
  parameters_01.outlineColor[1] = parameters.fillColor[3];
  parameters_01.outlineColor[2] = parameters.outlineColor[0];
  parameters_01.outlineColor[3] = parameters.outlineColor[1];
  parameters_01.pos[0] = parameters.outlineColor[2];
  parameters_01.pos[1] = parameters.outlineColor[3];
  parameters_01.shift[0] = parameters.pos[0];
  parameters_01.shift[1] = parameters.pos[1];
  parameters_01.fontSize = parameters.shift[0];
  parameters_01.boldness = parameters.shift[1];
  parameters_01.outlineWidth = parameters.fontSize;
  parameters_01.spaceType = (bov_space_type_t)parameters.boldness;
  bov_text_set_param(local_98,parameters_01);
  bov_text_set_outline_width(local_98,-1.0);
  local_b8[0] = 0.2;
  local_b8[1] = 0.2;
  local_b8[2] = 0.2;
  local_b8[3] = 1.0;
  bov_text_set_color(local_98,local_b8);
  shift._0_4_ = 0xbf800000;
  shift._4_4_ = 0x3ea8f5c3;
  bov_text_set_pos(local_98,(GLfloat *)&shift);
  builtin_memcpy(local_de,"varying outline shift",0x16);
  local_c8 = bov_text_new(local_de,0x88e4);
  parameters_02.fillColor[2] = parameters.fillColor[0];
  parameters_02.fillColor[3] = parameters.fillColor[1];
  parameters_02.fillColor._0_8_ = width;
  parameters_02.outlineColor[0] = parameters.fillColor[2];
  parameters_02.outlineColor[1] = parameters.fillColor[3];
  parameters_02.outlineColor[2] = parameters.outlineColor[0];
  parameters_02.outlineColor[3] = parameters.outlineColor[1];
  parameters_02.pos[0] = parameters.outlineColor[2];
  parameters_02.pos[1] = parameters.outlineColor[3];
  parameters_02.shift[0] = parameters.pos[0];
  parameters_02.shift[1] = parameters.pos[1];
  parameters_02.fontSize = parameters.shift[0];
  parameters_02.boldness = parameters.shift[1];
  parameters_02.outlineWidth = parameters.fontSize;
  parameters_02.spaceType = (bov_space_type_t)parameters.boldness;
  bov_text_set_param(local_c8,parameters_02);
  fontSize._0_4_ = 0xbf800000;
  fontSize._4_4_ = 0;
  bov_text_set_pos(local_c8,(GLfloat *)&fontSize);
  builtin_memcpy(local_fd,"varying size",0xd);
  local_f0 = bov_text_new(local_fd,0x88e4);
  parameters_03.fillColor[2] = parameters.fillColor[0];
  parameters_03.fillColor[3] = parameters.fillColor[1];
  parameters_03.fillColor._0_8_ = width;
  parameters_03.outlineColor[0] = parameters.fillColor[2];
  parameters_03.outlineColor[1] = parameters.fillColor[3];
  parameters_03.outlineColor[2] = parameters.outlineColor[0];
  parameters_03.outlineColor[3] = parameters.outlineColor[1];
  parameters_03.pos[0] = parameters.outlineColor[2];
  parameters_03.pos[1] = parameters.outlineColor[3];
  parameters_03.shift[0] = parameters.pos[0];
  parameters_03.shift[1] = parameters.pos[1];
  parameters_03.fontSize = parameters.shift[0];
  parameters_03.boldness = parameters.shift[1];
  parameters_03.outlineWidth = parameters.fontSize;
  parameters_03.spaceType = (bov_space_type_t)parameters.boldness;
  bov_text_set_param(local_f0,parameters_03);
  pixel._0_4_ = 0xbf800000;
  pixel._4_4_ = 0xbea8f5c3;
  bov_text_set_pos(local_f0,(GLfloat *)&pixel);
  memcpy((void *)((long)&unzoomable + 6),
         "This text is unmoovable and unzoomable. Its position and its size must be given in pixels"
         ,0x5a);
  local_110 = bov_text_new((GLubyte *)((long)&unzoomable + 6),0x88e4);
  bov_text_set_space_type(local_110,PIXEL_SPACE);
  aGStack_196[0] = '.';
  aGStack_196[1] = 'y';
  pixel64._0_1_ = 'o';
  pixel64._1_1_ = 'u';
  pixel64._2_1_ = ' ';
  pixel64._3_1_ = 'c';
  GStack_190 = 'a';
  GStack_18f = 'n';
  builtin_memcpy(local_18e,"\'t zoom on this point",0x16);
  local_178 = bov_text_new(aGStack_196,0x88e4);
  GVar4 = bov_window_get_yres(local_20);
  local_19c = (2.0 / GVar4) * 64.0;
  wtime._4_4_ = 0xbf800000;
  local_1a0 = local_19c * -1.1 + 1.0;
  bov_text_set_pos(local_178,(GLfloat *)((long)&wtime + 4));
  bov_text_set_fontsize(local_178,local_19c);
  bov_text_set_space_type(local_178,UNZOOMABLE_SPACE);
  while( true ) {
    iVar3 = bov_window_should_close(local_20);
    if (iVar3 != 0) break;
    local_1b0 = bov_window_get_time(local_20);
    dVar1 = sin(local_1b0);
    bov_text_set_outline_width(text,(float)(dVar1 * 0.6 + 0.6));
    bov_text_draw(local_20,text);
    pbVar2 = local_98;
    dVar1 = sin(local_1b0);
    bov_text_set_boldness(pbVar2,(float)(dVar1 * 0.5 + -0.1));
    bov_text_draw(local_20,local_98);
    pbVar2 = local_c8;
    dVar1 = sin(local_1b0 * 3.0);
    local_1b8 = (float)dVar1;
    dVar1 = cos(local_1b0 * 3.0);
    local_1b4 = (float)dVar1;
    bov_text_set_outline_shift(pbVar2,&local_1b8);
    bov_text_draw(local_20,local_c8);
    pbVar2 = local_f0;
    dVar1 = sin(local_1b0);
    bov_text_set_fontsize(pbVar2,(float)(dVar1 * 0.1 + 0.1));
    bov_text_draw(local_20,local_f0);
    bov_text_draw(local_20,local_110);
    bov_text_draw(local_20,local_178);
    bov_window_update(local_20);
  }
  printf("Ended correctly\n");
  bov_text_delete(text);
  bov_text_delete(local_98);
  bov_text_delete(local_c8);
  bov_window_delete(local_20);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bov_window_t* window = bov_window_new(0, 0, argv[0]);
	bov_window_set_color(window, (GLfloat[4]) {0.8, 0.8, 0.8, 1.0});


	bov_text_t* outline = bov_text_new(
		(GLubyte[]) {"varying outline width"},
		GL_STATIC_DRAW);

	// putting more than 1 on the alpha component for radiation effect
	bov_text_param_t parameters = {
		.outlineColor = {1.0, 0.0, 0.0, 2.0},
		.pos = {-1.0, 0.66},
		.fillColor = {0},// completely transparent
		.fontSize = 0.25,
		.boldness = 0.25,
		.outlineWidth = 0.5
	};
	bov_text_set_param(outline, parameters);


	bov_text_t* width = bov_text_new(
		(GLubyte[]) {"varying width"},
		GL_STATIC_DRAW);
	bov_text_set_param(width, parameters);
	bov_text_set_outline_width(width, -1.0);
	bov_text_set_color(width, (GLfloat[4]) {0.2, 0.2, 0.2, 1});
	bov_text_set_pos(width, (GLfloat[2]) {-1.0, 0.33});


	bov_text_t* shift = bov_text_new(
		(GLubyte[]) {"varying outline shift"},
		GL_STATIC_DRAW);
	bov_text_set_param(shift, parameters);
	bov_text_set_pos(shift, (GLfloat[2]) {-1.0, 0.0});

	bov_text_t* fontSize = bov_text_new(
		(GLubyte[]) {"varying size"},
		GL_STATIC_DRAW);
	bov_text_set_param(fontSize, parameters);
	bov_text_set_pos(fontSize, (GLfloat[2]) {-1.0, -0.33});



	bov_text_t* pixel = bov_text_new(
		(GLubyte[]) {"This text is unmoovable and unzoomable."
		             " Its position and its size"
		             " must be given in pixels"},
		GL_STATIC_DRAW);
	bov_text_set_space_type(pixel, PIXEL_SPACE);


	bov_text_t* unzoomable = bov_text_new(
		(GLubyte[]) {".you can't zoom on this point"},
		GL_STATIC_DRAW);
	GLfloat pixel64 = 2.0 / bov_window_get_yres(window) * 64.0; //~64 pixels height
	bov_text_set_pos(unzoomable, (GLfloat[2]) {-1.0, 1 - 1.1 * pixel64});
	bov_text_set_fontsize(unzoomable, pixel64);
	bov_text_set_space_type(unzoomable, UNZOOMABLE_SPACE);



	while(!bov_window_should_close(window)) {
		double wtime = bov_window_get_time(window);

		bov_text_set_outline_width(outline, 0.6 * sin(wtime) + 0.6);
		bov_text_draw(window, outline);

		bov_text_set_boldness(width, 0.5 * sin(wtime) - 0.1);
		bov_text_draw(window, width);

		bov_text_set_outline_shift(shift, (GLfloat[2]){
		                                sin(3 * wtime),
		                                cos(3 * wtime)});
		bov_text_draw(window, shift);

		bov_text_set_fontsize(fontSize, 0.1 * sin(wtime) + 0.1);
		bov_text_draw(window, fontSize);

		bov_text_draw(window, pixel);
		bov_text_draw(window, unzoomable);

		bov_window_update(window);
	}

	printf("Ended correctly\n");

	bov_text_delete(outline);
	bov_text_delete(width);
	bov_text_delete(shift);

	bov_window_delete(window);

	return EXIT_SUCCESS;
}